

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

LocalTime * Time::toLocal(Time *time)

{
  __suseconds_t _Var1;
  LocalTime *in_RDI;
  
  _Var1 = (time->timeSinceEpoch).tv_usec;
  (in_RDI->super_Time).timeSinceEpoch.tv_sec = (time->timeSinceEpoch).tv_sec;
  (in_RDI->super_Time).timeSinceEpoch.tv_usec = (ulong)(uint)_Var1;
  (in_RDI->super_Time)._vptr_Time = (_func_int **)&PTR_getAsDate_0011ecd0;
  return in_RDI;
}

Assistant:

LocalTime toLocal(const Time & time)
    {
/*        struct tm tmt;
        makeLocalTime((time_t)time.Second(), tmt);
        return LocalTime(timeGM(&tmt), time.microSecond());*/
        return LocalTime(time.Second(), time.microSecond());
    }